

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

simplex_t * __thiscall
Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
          (simplex_t *__return_storage_ptr__,
          Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this,vertex_t n,
          dimension_t k)

{
  logic_error *this_00;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  
  if (n + -1 <= (int)this) {
    return *(simplex_t **)
            (*(long *)((long)*__return_storage_ptr__ + (long)(char)n * 0x18) +
            (long)(int)this * 0x10);
  }
  this_00 = (logic_error *)
            __cxa_allocate_exception
                      (0x10,this,CONCAT44(in_register_00000014,n),CONCAT71(in_register_00000009,k));
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

simplex_t operator()(vertex_t n, dimension_t k) const {
      GUDHI_assert(n >= k - 1);
      return B[k][n];
    }